

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Table::Table(Table *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_880;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_868;
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5d3;
  undefined1 local_5d2;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d1;
  undefined1 local_5d0;
  allocator<char> local_5cf;
  allocator<char> local_5ce;
  allocator<char> local_5cd;
  allocator<char> local_5cc;
  allocator<char> local_5cb;
  allocator<char> local_5ca;
  allocator<char> local_5c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  iterator local_4e0;
  size_type local_4d8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c9 [2];
  allocator<char> local_4c7;
  allocator<char> local_4c6;
  allocator<char> local_4c5;
  allocator<char> local_4c4;
  allocator<char> local_4c3;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  iterator local_3d8;
  size_type local_3d0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c1 [2];
  allocator<char> local_3bf;
  allocator<char> local_3be;
  allocator<char> local_3bd;
  allocator<char> local_3bc;
  allocator<char> local_3bb;
  allocator<char> local_3ba;
  allocator<char> local_3b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  iterator local_2d0;
  size_type local_2c8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b9 [2];
  allocator<char> local_2b7;
  allocator<char> local_2b6;
  allocator<char> local_2b5;
  allocator<char> local_2b4;
  allocator<char> local_2b3;
  allocator<char> local_2b2;
  allocator<char> local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  iterator local_1c8;
  size_type local_1c0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b4 [2];
  allocator<char> local_1b2;
  allocator<char> local_1b1;
  allocator<char> local_1b0;
  allocator<char> local_1af;
  allocator<char> local_1ae;
  allocator<char> local_1ad [20];
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  undefined1 local_98 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  Table *this_local;
  
  this->score = 0x7fffffff;
  local_5d2 = 1;
  local_a0 = (undefined1  [8])local_98;
  local_1b4[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_198 = &local_190;
  local_20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"",&local_199);
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_170,"",local_1ad);
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"",&local_1ae);
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"",&local_1af);
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"",&local_1b0);
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"",&local_1b1);
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"",&local_1b2);
  local_1b4[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_b0 = &local_190;
  local_a8 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_1b4);
  __l_03._M_len = local_a8;
  __l_03._M_array = local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_98,__l_03,local_1b4);
  local_2b9[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_2b0 = &local_2a8;
  local_a0 = (undefined1  [8])(local_98 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"",&local_2b1);
  local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_288,"",&local_2b2);
  local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_268,"",&local_2b3);
  local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_248,"",&local_2b4);
  local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_228,"",&local_2b5);
  local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"",&local_2b6);
  local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"",&local_2b7);
  local_2b9[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_1c8 = &local_2a8;
  local_1c0 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_2b9);
  __l_02._M_len = local_1c0;
  __l_02._M_array = local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_98 + 0x18),__l_02,local_2b9);
  local_3c1[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_3b8 = &local_3b0;
  local_a0 = (undefined1  [8])&local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"",&local_3b9);
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_390,"",&local_3ba);
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_370,"",&local_3bb);
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_350,"",&local_3bc);
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_330,"",&local_3bd);
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_310,"",&local_3be);
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"",&local_3bf);
  local_3c1[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_2d0 = &local_3b0;
  local_2c8 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_3c1);
  __l_01._M_len = local_2c8;
  __l_01._M_array = local_2d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,__l_01,local_3c1);
  local_4c9[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_4c0 = &local_4b8;
  local_a0 = (undefined1  [8])&local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"",&local_4c1);
  local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_498,"",&local_4c2);
  local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_478,"",&local_4c3);
  local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_458,"",&local_4c4);
  local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_438,"",&local_4c5);
  local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_418,"",&local_4c6);
  local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3f8,"",&local_4c7);
  local_4c9[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_3d8 = &local_4b8;
  local_3d0 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_4c9);
  __l_00._M_len = local_3d0;
  __l_00._M_array = local_3d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,__l_00,local_4c9);
  local_5d0 = 1;
  local_5c8 = &local_5c0;
  local_a0 = (undefined1  [8])&local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"",&local_5c9);
  local_5c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"",&local_5ca);
  local_5c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_580,"",&local_5cb);
  local_5c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_560,"",&local_5cc);
  local_5c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_540,"",&local_5cd);
  local_5c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_520,"",&local_5ce);
  local_5c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_500,"",&local_5cf);
  local_5d0 = 0;
  local_4e0 = &local_5c0;
  local_4d8 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_5d1);
  __l._M_len = local_4d8;
  __l._M_array = local_4e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,__l,&local_5d1);
  local_5d2 = 0;
  local_20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98;
  local_20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x5;
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::allocator(&local_5d3);
  __l_04._M_len =
       (size_type)
       local_20.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  __l_04._M_array =
       (iterator)
       local_20.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->table,__l_04,&local_5d3);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~allocator(&local_5d3);
  local_868 = &local_20;
  do {
    local_868 = local_868 + -1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_868);
  } while (local_868 !=
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_98);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_5d1);
  local_880 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e0;
  do {
    local_880 = local_880 + -1;
    std::__cxx11::string::~string((string *)local_880);
  } while (local_880 != &local_5c0);
  std::allocator<char>::~allocator(&local_5cf);
  std::allocator<char>::~allocator(&local_5ce);
  std::allocator<char>::~allocator(&local_5cd);
  std::allocator<char>::~allocator(&local_5cc);
  std::allocator<char>::~allocator(&local_5cb);
  std::allocator<char>::~allocator(&local_5ca);
  std::allocator<char>::~allocator(&local_5c9);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_4c9);
  local_898 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3d8;
  do {
    local_898 = local_898 + -1;
    std::__cxx11::string::~string((string *)local_898);
  } while (local_898 != &local_4b8);
  std::allocator<char>::~allocator(&local_4c7);
  std::allocator<char>::~allocator(&local_4c6);
  std::allocator<char>::~allocator(&local_4c5);
  std::allocator<char>::~allocator(&local_4c4);
  std::allocator<char>::~allocator(&local_4c3);
  std::allocator<char>::~allocator(&local_4c2);
  std::allocator<char>::~allocator(&local_4c1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_3c1);
  local_8b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d0;
  do {
    local_8b0 = local_8b0 + -1;
    std::__cxx11::string::~string((string *)local_8b0);
  } while (local_8b0 != &local_3b0);
  std::allocator<char>::~allocator(&local_3bf);
  std::allocator<char>::~allocator(&local_3be);
  std::allocator<char>::~allocator(&local_3bd);
  std::allocator<char>::~allocator(&local_3bc);
  std::allocator<char>::~allocator(&local_3bb);
  std::allocator<char>::~allocator(&local_3ba);
  std::allocator<char>::~allocator(&local_3b9);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_2b9);
  local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8;
  do {
    local_8c8 = local_8c8 + -1;
    std::__cxx11::string::~string((string *)local_8c8);
  } while (local_8c8 != &local_2a8);
  std::allocator<char>::~allocator(&local_2b7);
  std::allocator<char>::~allocator(&local_2b6);
  std::allocator<char>::~allocator(&local_2b5);
  std::allocator<char>::~allocator(&local_2b4);
  std::allocator<char>::~allocator(&local_2b3);
  std::allocator<char>::~allocator(&local_2b2);
  std::allocator<char>::~allocator(&local_2b1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_1b4);
  local_8e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
  do {
    local_8e0 = local_8e0 + -1;
    std::__cxx11::string::~string((string *)local_8e0);
  } while (local_8e0 != &local_190);
  std::allocator<char>::~allocator(&local_1b2);
  std::allocator<char>::~allocator(&local_1b1);
  std::allocator<char>::~allocator(&local_1b0);
  std::allocator<char>::~allocator(&local_1af);
  std::allocator<char>::~allocator(&local_1ae);
  std::allocator<char>::~allocator(local_1ad);
  std::allocator<char>::~allocator(&local_199);
  return;
}

Assistant:

constexpr Table() = default;